

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpint.c
# Opt level: O0

void mp_cond_negate(mp_int *r,mp_int *x,uint yes)

{
  BignumInt BVar1;
  BignumInt BVar2;
  BignumDblInt ADC_temp;
  BignumInt xword;
  size_t i;
  BignumInt flip;
  BignumCarry carry;
  uint yes_local;
  mp_int *x_local;
  mp_int *r_local;
  
  flip = (BignumInt)yes;
  for (xword = 0; xword < r->nw; xword = xword + 1) {
    BVar1 = mp_word(x,xword);
    BVar2 = (-(ulong)yes ^ BVar1) + flip;
    flip = (BignumInt)CARRY8(-(ulong)yes ^ BVar1,flip);
    r->w[xword] = BVar2;
  }
  return;
}

Assistant:

static void mp_cond_negate(mp_int *r, mp_int *x, unsigned yes)
{
    BignumCarry carry = yes;
    BignumInt flip = -(BignumInt)yes;
    for (size_t i = 0; i < r->nw; i++) {
        BignumInt xword = mp_word(x, i);
        xword ^= flip;
        BignumADC(r->w[i], carry, 0, xword, carry);
    }
}